

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AST.cpp
# Opt level: O1

bool __thiscall AST::equalsList(AST *this,AST *t)

{
  bool bVar1;
  AST *t_00;
  AST *pAVar2;
  RefCount<AST> local_40;
  RefCount<AST> local_38;
  
  if (t == (AST *)0x0) {
LAB_001e4748:
    bVar1 = false;
  }
  else {
    do {
      bVar1 = equals(this,t);
      if (!bVar1) goto LAB_001e4748;
      local_40.ref = (this->down).ref;
      if (local_40.ref == (Ref *)0x0) {
        local_40.ref = (Ref *)0x0;
      }
      else {
        (local_40.ref)->count = (local_40.ref)->count + 1;
      }
      if (local_40.ref == (Ref *)0x0) {
        RefCount<AST>::~RefCount(&local_40);
LAB_001e4656:
        local_40.ref = (t->down).ref;
        if (local_40.ref == (Ref *)0x0) {
          local_40.ref = (Ref *)0x0;
        }
        else {
          (local_40.ref)->count = (local_40.ref)->count + 1;
        }
        if (local_40.ref == (Ref *)0x0) {
          RefCount<AST>::~RefCount(&local_40);
        }
        else {
          pAVar2 = (local_40.ref)->ptr;
          RefCount<AST>::~RefCount(&local_40);
          if (pAVar2 != (AST *)0x0) goto LAB_001e4748;
        }
      }
      else {
        pAVar2 = (local_40.ref)->ptr;
        RefCount<AST>::~RefCount(&local_40);
        if (pAVar2 == (AST *)0x0) goto LAB_001e4656;
        local_40.ref = (this->down).ref;
        if (local_40.ref == (Ref *)0x0) {
          local_40.ref = (Ref *)0x0;
        }
        else {
          (local_40.ref)->count = (local_40.ref)->count + 1;
        }
        if (local_40.ref == (Ref *)0x0) {
          pAVar2 = (AST *)0x0;
        }
        else {
          pAVar2 = (local_40.ref)->ptr;
        }
        local_38.ref = (t->down).ref;
        if (local_38.ref == (Ref *)0x0) {
          local_38.ref = (Ref *)0x0;
        }
        else {
          (local_38.ref)->count = (local_38.ref)->count + 1;
        }
        if (local_38.ref == (Ref *)0x0) {
          t_00 = (AST *)0x0;
        }
        else {
          t_00 = (local_38.ref)->ptr;
        }
        bVar1 = equalsList(pAVar2,t_00);
        RefCount<AST>::~RefCount(&local_38);
        RefCount<AST>::~RefCount(&local_40);
        if (!bVar1) goto LAB_001e4748;
      }
      local_40.ref = (this->right).ref;
      if (local_40.ref == (Ref *)0x0) {
        local_40.ref = (Ref *)0x0;
      }
      else {
        (local_40.ref)->count = (local_40.ref)->count + 1;
      }
      if (local_40.ref == (Ref *)0x0) {
        this = (AST *)0x0;
      }
      else {
        this = (local_40.ref)->ptr;
      }
      local_38.ref = (t->right).ref;
      if (local_38.ref == (Ref *)0x0) {
        local_38.ref = (Ref *)0x0;
      }
      else {
        (local_38.ref)->count = (local_38.ref)->count + 1;
      }
      if (local_38.ref == (Ref *)0x0) {
        t = (AST *)0x0;
      }
      else {
        t = (local_38.ref)->ptr;
      }
      RefCount<AST>::~RefCount(&local_38);
      RefCount<AST>::~RefCount(&local_40);
    } while ((t != (AST *)0x0) && (this != (AST *)0x0));
    bVar1 = t == (AST *)0x0 && this == (AST *)0x0;
  }
  return bVar1;
}

Assistant:

bool AST::equalsList(const AST* t) const
{
	// the empty tree is not a match of any non-null tree.
	if (!t)
		return false;

	// Otherwise, start walking sibling lists.  First mismatch, return false.
	const AST* sibling=this;
	for (;sibling && t;
			sibling=sibling->getNextSibling(), t=t->getNextSibling()) {
		// as a quick optimization, check roots first.
		if (!sibling->equals(t))
			return false;
		// if roots match, do full list match test on children.
		if (sibling->getFirstChild()) {
			if (!sibling->getFirstChild()->equalsList(t->getFirstChild()))
				return false;
		}
		// sibling has no kids, make sure t doesn't either
		else if (t->getFirstChild())
			return false;
	}

	if (!sibling && !t)
		return true;

	// one sibling list has more than the other
	return false;
}